

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O3

int GF2::Env::Init(void)

{
  uint uVar1;
  FILE *__stream;
  char *pcVar2;
  char filename [256];
  char acStack_108 [256];
  
  uVar1 = getpid();
  sprintf(acStack_108,"/proc/%d/cmdline",(ulong)uVar1);
  __stream = fopen(acStack_108,"r");
  if (__stream == (FILE *)0x0) {
    builtin_strncpy(_name,"gf2app",7);
  }
  else {
    pcVar2 = fgets(_name,0x80,__stream);
    if (pcVar2 == (char *)0x0) {
      builtin_strncpy(_name,"gf2app",7);
    }
    fclose(__stream);
  }
  return 0;
}

Assistant:

int Env::Init()
{	
	// получить имя
#if defined OS_WIN
	::STARTUPINFOA si;
	::GetStartupInfoA(&si);
	if (::strlen(si.lpTitle) >= sizeof(_name))
		::strncpy(_name, si.lpTitle, sizeof(_name) - 1);
	else
		::strcpy(_name, si.lpTitle);
#elif defined OS_LINUX
	char filename[256];
	::sprintf(filename, "/proc/%d/cmdline", ::getpid());
	FILE* f = ::fopen(filename, "r");
	if (f) 
	{
	    if (::fgets(_name, sizeof(_name), f) == 0)
			::strcpy(_name, "gf2app");
	    ::fclose(f);
	}
	else
		::strcpy(_name, "gf2app");
#else	
	::strcpy(_name, "gf2app");
#endif	
	return 0;
}